

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test2::test
          (GPUShaderFP64Test2 *this,shaderStage shader_stage,uniformTypeDetails *uniform_type)

{
  byte bVar1;
  bool bVar2;
  GLenum GVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar8;
  GLchar *local_200;
  MessageBuilder local_1f8;
  byte local_61;
  undefined1 local_60 [7];
  bool result;
  programInfo program_info;
  GLsizei n_vertices;
  Functions *gl;
  GLenum draw_primitive;
  uniformTypeDetails *uniform_type_local;
  shaderStage shader_stage_local;
  GPUShaderFP64Test2 *this_local;
  long lVar7;
  
  GVar3 = getDrawPrimitiveType(this,shader_stage);
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  program_info._36_4_ = 0x400;
  if (shader_stage == FRAGMENT_SHADER) {
    program_info._36_4_ = 4;
  }
  Utils::programInfo::programInfo((programInfo *)local_60,(this->super_TestCase).m_context);
  local_61 = 1;
  prepareProgram(this,shader_stage,uniform_type,(programInfo *)local_60);
  (**(code **)(lVar7 + 0x1680))(program_info.m_fragment_shader_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x10bf);
  prepareUniforms(this,shader_stage,uniform_type,(programInfo *)local_60);
  testBegin(this,program_info.m_fragment_shader_id,shader_stage);
  if (shader_stage == COMPUTE_SHADER) {
    (*this->m_pDispatchCompute)(0x20,0x20,1);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"DispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x10cb);
  }
  else {
    (**(code **)(lVar7 + 0x538))(GVar3,0,program_info._36_4_);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"DrawArrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x10d0);
  }
  testEnd(this,shader_stage);
  bVar2 = verifyResults(this,shader_stage);
  if (!bVar2) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1f8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_1f8,(char (*) [15])"Shader stage: ");
    local_200 = getShaderStageName(this,shader_stage);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_200);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [17])". Uniform type: ");
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&uniform_type->m_type_name);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1f8);
    local_61 = 0;
  }
  bVar1 = local_61;
  Utils::programInfo::~programInfo((programInfo *)local_60);
  return (bool)(bVar1 & 1);
}

Assistant:

bool GPUShaderFP64Test2::test(shaderStage shader_stage, const uniformTypeDetails& uniform_type) const
{
	const glw::GLenum		draw_primitive = getDrawPrimitiveType(shader_stage);
	static const glw::GLint first_vertex   = 0;
	const glw::Functions&   gl			   = m_context.getRenderContext().getFunctions();
	const glw::GLsizei		n_vertices	 = (FRAGMENT_SHADER == shader_stage) ? 4 : m_n_captured_results;
	Utils::programInfo		program_info(m_context);
	bool					result = true;

	/* Prepare program */
	prepareProgram(shader_stage, uniform_type, program_info);

	gl.useProgram(program_info.m_program_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "UseProgram");

	/* Prepare uniform buffer and bind it with uniform block */
	prepareUniforms(shader_stage, uniform_type, program_info);

	/* Prepare storage for test results */
	testBegin(program_info.m_program_object_id, shader_stage);

	/* Execute */
	if (COMPUTE_SHADER == shader_stage)
	{
		m_pDispatchCompute(m_texture_width, m_texture_height, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");
	}
	else
	{
		gl.drawArrays(draw_primitive, first_vertex, n_vertices);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DrawArrays");
	}

	/* Clean after test */
	testEnd(shader_stage);

	/* Check results */
	if (false == verifyResults(shader_stage))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Shader stage: " << getShaderStageName(shader_stage)
			<< ". Uniform type: " << uniform_type.m_type_name << tcu::TestLog::EndMessage;

		result = false;
	}

	return result;
}